

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

int __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::removeMin
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this)

{
  int iVar1;
  Size SVar2;
  int *piVar3;
  vec<int,_int> *in_RDI;
  int x;
  int in_stack_0000002c;
  Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *in_stack_00000030;
  int k;
  vec<int,_int> *this_00;
  
  piVar3 = vec<int,_int>::operator[](in_RDI,0);
  iVar1 = *piVar3;
  piVar3 = vec<int,_int>::last(in_RDI);
  k = *piVar3;
  piVar3 = vec<int,_int>::operator[](in_RDI,0);
  *piVar3 = k;
  this_00 = in_RDI + 1;
  vec<int,_int>::operator[](in_RDI,0);
  piVar3 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[]
                     ((IntMap<int,_int,_Minisat::MkIndexDefault<int>_> *)this_00,k);
  *piVar3 = 0;
  piVar3 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[]
                     ((IntMap<int,_int,_Minisat::MkIndexDefault<int>_> *)this_00,k);
  *piVar3 = -1;
  vec<int,_int>::pop(in_RDI);
  SVar2 = vec<int,_int>::size(in_RDI);
  if (1 < SVar2) {
    percolateDown(in_stack_00000030,in_stack_0000002c);
  }
  return iVar1;
}

Assistant:

K removeMin()
    {
        K x              = heap[0];
        heap[0]          = heap.last();
        indices[heap[0]] = 0;
        indices[x]       = -1;
        heap.pop();
        if (heap.size() > 1) percolateDown(0);
        return x; 
    }